

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  Definition *pDVar1;
  bool bVar2;
  Value *pVVar3;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  FieldDef *local_d0;
  FieldDef *field;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  Type type;
  string local_58 [8];
  string dc;
  string name;
  StructDef *struct_def_local;
  Parser *this_local;
  
  std::__cxx11::string::string((string *)(dc.field_2._M_local_buf + 8),(string *)&this->attribute_);
  std::__cxx11::string::string(local_58,(string *)&this->doc_comment_);
  Expect(this,4);
  Expect(this,0x3a);
  Type::Type((Type *)local_80,BASE_TYPE_NONE,(StructDef *)0x0);
  ParseType(this,(Type *)local_80);
  if ((struct_def->fixed & 1U) != 0) {
    bVar2 = IsScalar(local_80._0_4_);
    if (!bVar2) {
      bVar2 = IsStruct((Type *)local_80);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a0,"structs_ may contain only scalar or struct fields",&local_a1
                  );
        Error(&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
    }
  }
  if (local_80._0_4_ == BASE_TYPE_UNION) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dc.field_2 + 8),"_type");
    AddField(this,struct_def,(string *)&field,(Type *)&(type.struct_def)->minalign);
    std::__cxx11::string::~string((string *)&field);
  }
  local_d0 = AddField(this,struct_def,(string *)((long)&dc.field_2 + 8),(Type *)local_80);
  if (this->token_ == 0x3d) {
    Next(this);
    ParseSingleValue(this,&local_d0->value);
  }
  std::__cxx11::string::operator=((string *)&(local_d0->super_Definition).doc_comment,local_58);
  ParseMetaData(this,&local_d0->super_Definition);
  pDVar1 = &local_d0->super_Definition;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"deprecated",&local_f1);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(&pDVar1->attributes,&local_f0);
  local_d0->deprecated = pVVar3 != (Value *)0x0;
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (((local_d0->deprecated & 1U) != 0) && ((struct_def->fixed & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_118,"can\'t deprecate fields in a struct",&local_119);
    Error(&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  Expect(this,0x3b);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(dc.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;
  std::string dc = doc_comment_;
  Expect(kTokenIdentifier);
  Expect(':');
  Type type;
  ParseType(type);

  if (struct_def.fixed && !IsScalar(type.base_type) && !IsStruct(type))
    Error("structs_ may contain only scalar or struct fields");

  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with _type appended as the name.
    AddField(struct_def, name + "_type", type.enum_def->underlying_type);
  }

  auto &field = AddField(struct_def, name, type);

  if (token_ == '=') {
    Next();
    ParseSingleValue(field.value);
  }

  field.doc_comment = dc;
  ParseMetaData(field);
  field.deprecated = field.attributes.Lookup("deprecated") != nullptr;
  if (field.deprecated && struct_def.fixed)
    Error("can't deprecate fields in a struct");

  Expect(';');
}